

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ndp.h
# Opt level: O2

bool __thiscall
libDAI::NDP::VariableHasLowerDegree::operator()(VariableHasLowerDegree *this,Var i,Var j)

{
  FactorGraph *pFVar1;
  pointer pvVar2;
  int iVar3;
  int iVar4;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  long local_38;
  size_t local_30;
  long local_28;
  size_t local_20;
  
  local_20 = i._states;
  local_28 = i._label;
  local_30 = j._states;
  local_38 = j._label;
  pFVar1 = this->_m_grm;
  iVar3 = (*(pFVar1->super_GraphicalModel)._vptr_GraphicalModel[8])(pFVar1,&local_28);
  iVar4 = (*(pFVar1->super_GraphicalModel)._vptr_GraphicalModel[8])(pFVar1,&local_38);
  pvVar2 = (pFVar1->_fg)._nb1.
           super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  return (ulong)((long)pvVar2[CONCAT44(extraout_var,iVar3)].
                       super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                       super__Vector_impl_data._M_finish -
                *(long *)&pvVar2[CONCAT44(extraout_var,iVar3)].
                          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                          super__Vector_impl_data) <
         (ulong)((long)pvVar2[CONCAT44(extraout_var_00,iVar4)].
                       super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                       super__Vector_impl_data._M_finish -
                *(long *)&pvVar2[CONCAT44(extraout_var_00,iVar4)].
                          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                          super__Vector_impl_data);
}

Assistant:

bool operator()  (Var i, Var j) const
                { 
                    const FactorGraph& g = _m_grm;
                    size_t ind_i =  g.findVar(i);
                    size_t ind_j =  g.findVar(j);
                    size_t di = g.nbV(ind_i).size();
                    size_t dj = g.nbV(ind_j).size();
                    return (di<dj); 
                }